

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::_::BTreeImpl::growTree(BTreeImpl *this,uint minCapacity)

{
  Fault local_38;
  Fault f;
  NodeUnion *newTree;
  uint local_20;
  WiderType<Decay<unsigned_int_&>,_Decay<unsigned_int>_> local_1c;
  WiderType<Decay<unsigned_int>,_Decay<int>_> local_18;
  uint local_14;
  uint newCapacity;
  uint minCapacity_local;
  BTreeImpl *this_local;
  
  local_20 = this->treeCapacity << 1;
  local_14 = minCapacity;
  _newCapacity = this;
  local_1c = max<unsigned_int&,unsigned_int>(&local_14,&local_20);
  newTree._4_4_ = 4;
  local_18 = max<unsigned_int,int>(&local_1c,(int *)((long)&newTree + 4));
  this->freelistSize = (local_18 - this->treeCapacity) + this->freelistSize;
  f.exception = (Exception *)aligned_alloc(0x40,(ulong)local_18 << 6);
  if (f.exception != (Exception *)0x0) {
    acopy<kj::_::BTreeImpl::NodeUnion>
              ((NodeUnion *)f.exception,this->tree,(ulong)this->treeCapacity);
    azero<kj::_::BTreeImpl::NodeUnion>
              ((NodeUnion *)((f.exception)->trace + (ulong)this->treeCapacity * 8 + -10),
               (ulong)(local_18 - this->treeCapacity));
    if (this->tree != (NodeUnion *)EMPTY_NODE) {
      ::free(this->tree);
    }
    this->tree = (NodeUnion *)f.exception;
    this->treeCapacity = local_18;
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],unsigned_int&>
            (&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
             ,0x137,FAILED,"newTree != nullptr","\"memory allocation failed\", newCapacity",
             (char (*) [25])"memory allocation failed",&local_18);
  Debug::Fault::fatal(&local_38);
}

Assistant:

void BTreeImpl::growTree(uint minCapacity) {
  uint newCapacity = kj::max(kj::max(minCapacity, treeCapacity * 2), 4);
  freelistSize += newCapacity - treeCapacity;

  // Allocate some aligned memory! In theory this should be as simple as calling the C11 standard
  // aligned_alloc() function. Unfortunately, many platforms don't implement it. Luckily, there
  // are usually alternatives.

#if __APPLE__ || __BIONIC__
  // OSX and Android lack aligned_alloc(), but have posix_memalign(). Fine.
  void* allocPtr;
  int error = posix_memalign(&allocPtr,
      sizeof(BTreeImpl::NodeUnion), newCapacity * sizeof(BTreeImpl::NodeUnion));
  if (error != 0) {
    KJ_FAIL_SYSCALL("posix_memalign", error);
  }
  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(allocPtr);
#elif _WIN32
  // Windows lacks aligned_alloc() but has its own _aligned_malloc() (which requires freeing using
  // _aligned_free()).
  // WATCH OUT: The argument order for _aligned_malloc() is opposite of aligned_alloc()!
  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(
      _aligned_malloc(newCapacity * sizeof(BTreeImpl::NodeUnion), sizeof(BTreeImpl::NodeUnion)));
  KJ_ASSERT(newTree != nullptr, "memory allocation failed", newCapacity);
#else
  // Let's use the C11 standard.
  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(
      aligned_alloc(sizeof(BTreeImpl::NodeUnion), newCapacity * sizeof(BTreeImpl::NodeUnion)));
  KJ_ASSERT(newTree != nullptr, "memory allocation failed", newCapacity);
#endif

  acopy(newTree, tree, treeCapacity);
  azero(newTree + treeCapacity, newCapacity - treeCapacity);
  if (tree != &EMPTY_NODE) aligned_free(tree);
  tree = newTree;
  treeCapacity = newCapacity;
}